

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  size_t sVar3;
  void *pvVar4;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  undefined4 local_464;
  ParseError *e;
  string local_450;
  allocator local_429;
  string local_428;
  allocator local_401;
  string local_400;
  double local_3e0;
  double value;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  Option *local_360;
  Option *copt;
  int count;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  Option *local_2e0;
  Option *opt;
  string file;
  string local_2b0;
  undefined1 local_290 [8];
  App app;
  allocator local_89;
  string local_88;
  AutoTimer local_68;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"This is a timer",&local_89);
  std::function<std::__cxx11::string(std::__cxx11::string,std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string,std::__cxx11::string),void>
            ((function<std::__cxx11::string(std::__cxx11::string,std::__cxx11::string)> *)
             &app.config_ptr_,CLI::Timer::Simple);
  CLI::AutoTimer::AutoTimer(&local_68,&local_88,(time_print_t *)&app.config_ptr_);
  CLI::AutoTimer::~AutoTimer(&local_68);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&app.config_ptr_);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b0,"K3Pi goofit fitter",
             (allocator *)(file.field_2._M_local_buf + 0xf));
  CLI::App::App((App *)local_290,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&opt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"-f,--file,file",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"File name",&local_329);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_290,&local_300,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                      &local_328);
  pOVar1 = CLI::OptionBase<CLI::Option>::required(&pOVar1->super_OptionBase<CLI::Option>,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&count,"Important",(allocator *)((long)&copt + 7));
  pOVar1 = CLI::OptionBase<CLI::Option>::group
                     (&pOVar1->super_OptionBase<CLI::Option>,(string *)&count);
  std::__cxx11::string::~string((string *)&count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&copt + 7));
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  local_2e0 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"-c,--count",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"Counter",&local_3a9);
  pOVar1 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     ((App *)local_290,&local_380,(int *)&copt,&local_3a8);
  pOVar1 = CLI::OptionBase<CLI::Option>::required(&pOVar1->super_OptionBase<CLI::Option>,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"Important",(allocator *)((long)&value + 7));
  pOVar1 = CLI::OptionBase<CLI::Option>::group(&pOVar1->super_OptionBase<CLI::Option>,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  local_360 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"-d,--double",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"Some Value",&local_429);
  pOVar1 = CLI::App::add_option<double,_(CLI::detail::enabler)0>
                     ((App *)local_290,&local_400,&local_3e0,&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"Other",(allocator *)((long)&e + 7));
  CLI::OptionBase<CLI::Option>::group(&pOVar1->super_OptionBase<CLI::Option>,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  CLI::App::parse((App *)local_290,(int)argv_local,local_18);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar2 = std::operator<<(poVar2,(string *)&opt);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"--file",&local_489);
  sVar3 = CLI::App::count((App *)local_290,&local_488);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  sVar3 = CLI::Option::count(local_2e0);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)copt);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,"--count",&local_4b1);
  sVar3 = CLI::App::count((App *)local_290,&local_4b0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  sVar3 = CLI::Option::count(local_360);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Some value: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar2,local_3e0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  argv_local._4_4_ = 0;
  local_464 = 1;
  std::__cxx11::string::~string((string *)&opt);
  CLI::App::~App((App *)local_290);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    CLI::AutoTimer("This is a timer");

    CLI::App app("K3Pi goofit fitter");

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name")->required()->group("Important");

    int count;
    CLI::Option *copt = app.add_flag("-c,--count", count, "Counter")->required()->group("Important");

    double value; // = 3.14;
    app.add_option("-d,--double", value, "Some Value")->group("Other");

    try {
        app.parse(argc, argv);
    } catch(const CLI::ParseError &e) {
        return app.exit(e);
    }

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << std::endl;
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << std::endl;
    std::cout << "Some value: " << value << std::endl;

    return 0;
}